

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SEQUENCE_OF.c
# Opt level: O2

asn_enc_rval_t *
SEQUENCE_OF_encode_uper
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  asn_TYPE_member_s *paVar1;
  long lVar2;
  void *pvVar3;
  asn_TYPE_descriptor_s *paVar4;
  int iVar5;
  long lVar6;
  asn_per_constraint_s *paVar7;
  bool bVar8;
  ssize_t sVar9;
  ssize_t sVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  asn_enc_rval_t local_48;
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  paVar1 = td->elements;
  if ((constraints == (asn_per_constraints_t *)0x0) &&
     (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) {
LAB_00144cb1:
    bVar8 = true;
    paVar7 = (asn_per_constraint_s *)0x0;
LAB_00144cf2:
    uVar12 = 0xffffffffffffffff;
    sVar9 = 0;
    while( true ) {
      iVar5 = *(int *)((long)sptr + 8);
      sVar10 = (ssize_t)iVar5;
      iVar11 = (int)uVar12;
      if (iVar5 <= iVar11) break;
      uVar12 = uVar12 & 0xffffffff;
      if (iVar11 < 1) {
        uVar12 = 0;
      }
      if (((bVar8) || (paVar7->effective_bits < 0)) &&
         (sVar10 = uper_put_length(po,(long)(iVar5 - (int)uVar12)), sVar10 < 0)) goto LAB_00144d7c;
      while (bVar13 = sVar10 != 0, sVar10 = sVar10 + -1, bVar13) {
        pvVar3 = *(void **)(*sptr + uVar12 * 8);
        if (pvVar3 == (void *)0x0) goto LAB_00144d7c;
        uVar12 = uVar12 + 1;
        paVar4 = paVar1->type;
        (*paVar4->uper_encoder)(&local_48,paVar4,paVar1->per_constraints,pvVar3,po);
        sVar9 = local_48.encoded;
        if (local_48.encoded == -1) goto LAB_00144d7c;
      }
    }
    __return_storage_ptr__->encoded = sVar9;
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  else {
    paVar7 = &constraints->size;
    lVar6 = (long)*(int *)((long)sptr + 8);
    if (lVar6 < (constraints->size).lower_bound) {
      bVar8 = true;
      if ((paVar7->flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) goto LAB_00144c97;
LAB_00144c8a:
      if ((constraints->size).effective_bits < 0) goto LAB_00144cc0;
    }
    else {
      lVar2 = (constraints->size).upper_bound;
      bVar8 = lVar2 < lVar6;
      if (((constraints->size).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
        if (lVar2 < lVar6) goto LAB_00144c8a;
      }
      else {
LAB_00144c97:
        iVar5 = per_put_few_bits(po,(uint)bVar8,1);
        if (iVar5 != 0) goto LAB_00144d7c;
        if (bVar8 != false) goto LAB_00144cb1;
      }
LAB_00144cc0:
      iVar5 = (constraints->size).effective_bits;
      if ((iVar5 < 0) ||
         (iVar5 = per_put_few_bits(po,*(int *)((long)sptr + 8) -
                                      (int)(constraints->size).lower_bound,iVar5), iVar5 == 0)) {
        bVar8 = false;
        goto LAB_00144cf2;
      }
    }
LAB_00144d7c:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
SEQUENCE_OF_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_anonymous_sequence_ *list;
	asn_per_constraint_t *ct;
	asn_enc_rval_t er;
	asn_TYPE_member_t *elm = td->elements;
	int seq;

	if(!sptr) ASN__ENCODE_FAILED;
	list = _A_SEQUENCE_FROM_VOID(sptr);

	er.encoded = 0;

	ASN_DEBUG("Encoding %s as SEQUENCE OF (%d)", td->name, list->count);

	if(constraints) ct = &constraints->size;
	else if(td->per_constraints) ct = &td->per_constraints->size;
	else ct = 0;

	/* If extensible constraint, check if size is in root */
	if(ct) {
		int not_in_root = (list->count < ct->lower_bound
				|| list->count > ct->upper_bound);
		ASN_DEBUG("lb %ld ub %ld %s",
			ct->lower_bound, ct->upper_bound,
			ct->flags & APC_EXTENSIBLE ? "ext" : "fix");
		if(ct->flags & APC_EXTENSIBLE) {
			/* Declare whether size is in extension root */
			if(per_put_few_bits(po, not_in_root, 1))
				ASN__ENCODE_FAILED;
			if(not_in_root) ct = 0;
		} else if(not_in_root && ct->effective_bits >= 0)
			ASN__ENCODE_FAILED;
	}

	if(ct && ct->effective_bits >= 0) {
		/* X.691, #19.5: No length determinant */
		if(per_put_few_bits(po, list->count - ct->lower_bound,
				ct->effective_bits))
			ASN__ENCODE_FAILED;
	}

	for(seq = -1; seq < list->count;) {
		ssize_t mayEncode;
		if(seq < 0) seq = 0;
		if(ct && ct->effective_bits >= 0) {
			mayEncode = list->count;
		} else {
			mayEncode = uper_put_length(po, list->count - seq);
			if(mayEncode < 0) ASN__ENCODE_FAILED;
		}

		while(mayEncode--) {
			void *memb_ptr = list->array[seq++];
			if(!memb_ptr) ASN__ENCODE_FAILED;
			er = elm->type->uper_encoder(elm->type,
				elm->per_constraints, memb_ptr, po);
			if(er.encoded == -1)
				ASN__ENCODE_FAILED;
		}
	}

	ASN__ENCODED_OK(er);
}